

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_get_asn1_uint64_with_tag(CBS *cbs,uint64_t *out,CBS_ASN1_TAG tag)

{
  int iVar1;
  uint8_t *puVar2;
  size_t sVar3;
  ulong local_50;
  size_t i;
  size_t len;
  uint8_t *data;
  CBS bytes;
  CBS_ASN1_TAG tag_local;
  uint64_t *out_local;
  CBS *cbs_local;
  
  bytes.len._4_4_ = tag;
  iVar1 = CBS_get_asn1(cbs,(CBS *)&data,tag);
  if ((iVar1 != 0) && (iVar1 = CBS_is_unsigned_asn1_integer((CBS *)&data), iVar1 != 0)) {
    *out = 0;
    puVar2 = CBS_data((CBS *)&data);
    sVar3 = CBS_len((CBS *)&data);
    local_50 = 0;
    while( true ) {
      if (sVar3 <= local_50) {
        return 1;
      }
      if (*out >> 0x38 != 0) break;
      *out = *out << 8;
      *out = (ulong)puVar2[local_50] | *out;
      local_50 = local_50 + 1;
    }
    return 0;
  }
  return 0;
}

Assistant:

int CBS_get_asn1_uint64_with_tag(CBS *cbs, uint64_t *out, CBS_ASN1_TAG tag) {
  CBS bytes;
  if (!CBS_get_asn1(cbs, &bytes, tag) ||
      !CBS_is_unsigned_asn1_integer(&bytes)) {
    return 0;
  }

  *out = 0;
  const uint8_t *data = CBS_data(&bytes);
  size_t len = CBS_len(&bytes);
  for (size_t i = 0; i < len; i++) {
    if ((*out >> 56) != 0) {
      // Too large to represent as a uint64_t.
      return 0;
    }
    *out <<= 8;
    *out |= data[i];
  }

  return 1;
}